

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  TValue *pTVar4;
  ulong in_RAX;
  ushort uVar5;
  int iVar6;
  size_t size;
  TString *pTVar7;
  char *__assertion;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  lu_byte x;
  ulong local_38;
  
  if ((D->strip == 0) && (f->source != psource)) {
    local_38 = in_RAX;
    DumpString(f->source,D);
  }
  else {
    local_38 = in_RAX & 0xffffffffffffff00;
    DumpBlock(&local_38,1,D);
  }
  local_38._0_4_ = f->linedefined;
  DumpBlock(&local_38,4,D);
  local_38 = CONCAT44(local_38._4_4_,f->lastlinedefined);
  DumpBlock(&local_38,4,D);
  local_38._0_1_ = f->numparams;
  DumpBlock(&local_38,1,D);
  local_38._0_1_ = f->is_vararg;
  DumpBlock(&local_38,1,D);
  local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
  DumpBlock(&local_38,1,D);
  local_38._0_4_ = f->sizecode;
  DumpBlock(&local_38,4,D);
  DumpBlock(f->code,(long)f->sizecode << 2,D);
  iVar6 = f->sizek;
  local_38 = CONCAT44(local_38._4_4_,iVar6);
  DumpBlock(&local_38,4,D);
  if (0 < (long)iVar6) {
    lVar8 = 0;
    do {
      pTVar4 = f->k;
      local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar4->tt_ + lVar8)) &
                 0xffffffffffffff7f;
      DumpBlock(&local_38,1,D);
      uVar2 = *(ushort *)((long)&pTVar4->tt_ + lVar8);
      uVar5 = uVar2 & 0x7f;
      switch(uVar5) {
      case 0:
        break;
      case 1:
        if (uVar2 != 1) {
          __assert_fail("((((o))->tt_) == (1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                        ,0x74,"void DumpConstants(const Proto *, DumpState *)");
        }
        local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar4->value_ + lVar8));
        size = 1;
        goto LAB_00115da7;
      case 2:
switchD_00115d25_caseD_2:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                      ,0x81,"void DumpConstants(const Proto *, DumpState *)");
      case 3:
        if (uVar2 != 3) {
          __assert_fail("((((o))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                        ,0x77,"void DumpConstants(const Proto *, DumpState *)");
        }
        local_38 = *(ulong *)((long)&pTVar4->value_ + lVar8);
        goto LAB_00115da2;
      case 4:
switchD_00115d25_caseD_4:
        if ((uVar2 & 0xf) != 4) {
          __assertion = "(((((((o))->tt_)) & 0x0F)) == (4))";
LAB_0011605c:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                        ,0x7e,"void DumpConstants(const Proto *, DumpState *)");
        }
        pTVar7 = *(TString **)((long)&pTVar4->value_ + lVar8);
        if ((pTVar7->tt & 0xf) != 4) {
          __assertion = "(((((o)->value_).gc)->tt) & 0x0F) == 4";
          goto LAB_0011605c;
        }
        DumpString(pTVar7,D);
        break;
      default:
        if (uVar5 != 0x13) {
          if (uVar5 != 0x14) goto switchD_00115d25_caseD_2;
          goto switchD_00115d25_caseD_4;
        }
        if (uVar2 != 0x13) {
          __assert_fail("((((o))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                        ,0x7a,"void DumpConstants(const Proto *, DumpState *)");
        }
        local_38 = *(ulong *)((long)&pTVar4->value_ + lVar8);
LAB_00115da2:
        size = 8;
LAB_00115da7:
        DumpBlock(&local_38,size,D);
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar8);
  }
  iVar6 = f->sizeupvalues;
  local_38 = CONCAT44(local_38._4_4_,iVar6);
  DumpBlock(&local_38,4,D);
  if (0 < (long)iVar6) {
    lVar8 = 0;
    do {
      local_38._0_1_ = (&f->upvalues->instack)[lVar8];
      DumpBlock(&local_38,1,D);
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar8]);
      DumpBlock(&local_38,1,D);
      lVar8 = lVar8 + 0x18;
    } while ((long)iVar6 * 0x18 != lVar8);
  }
  iVar6 = f->sizep;
  local_38 = CONCAT44(local_38._4_4_,iVar6);
  DumpBlock(&local_38,4,D);
  if (0 < (long)iVar6) {
    lVar8 = 0;
    do {
      DumpFunction(f->p[lVar8],f->source,D);
      lVar8 = lVar8 + 1;
    } while (iVar6 != lVar8);
  }
  iVar6 = 0;
  if (D->strip == 0) {
    iVar6 = f->sizelineinfo;
  }
  local_38._0_4_ = iVar6;
  DumpBlock(&local_38,4,D);
  DumpBlock(f->lineinfo,(long)iVar6 << 2,D);
  uVar3 = f->sizelocvars;
  uVar11 = (ulong)uVar3;
  uVar10 = uVar3;
  if (D->strip != 0) {
    lVar8 = uVar11 * 0x20 + -8;
    do {
      uVar9 = (uint)uVar11;
      uVar10 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar9 < 1) break;
      uVar11 = (ulong)(uVar9 - 1);
      piVar1 = (int *)((long)&f->locvars->varname + lVar8);
      lVar8 = lVar8 + -0x20;
      uVar10 = uVar9;
    } while (*piVar1 == -1);
  }
  local_38 = CONCAT44(local_38._4_4_,uVar10);
  DumpBlock(&local_38,4,D);
  if (0 < (int)uVar10) {
    lVar8 = 0;
    do {
      if (D->strip == 0) {
        pTVar7 = *(TString **)((long)&f->locvars->varname + lVar8);
      }
      else {
        pTVar7 = (TString *)0x0;
      }
      DumpString(pTVar7,D);
      local_38._0_4_ = *(undefined4 *)((long)&f->locvars->startpc + lVar8);
      DumpBlock(&local_38,4,D);
      local_38._0_4_ = *(undefined4 *)((long)&f->locvars->endpc + lVar8);
      DumpBlock(&local_38,4,D);
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)((long)&f->locvars->ravi_type_map + lVar8));
      DumpBlock(&local_38,4,D);
      DumpString(*(TString **)((long)&f->locvars->usertype + lVar8),D);
      lVar8 = lVar8 + 0x20;
    } while ((ulong)uVar10 << 5 != lVar8);
  }
  uVar3 = f->sizeupvalues;
  uVar11 = (ulong)uVar3;
  uVar10 = uVar3;
  if (D->strip != 0) {
    lVar8 = uVar11 * 0x18 + -8;
    do {
      uVar9 = (uint)uVar11;
      uVar10 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar9 < 1) break;
      uVar11 = (ulong)(uVar9 - 1);
      piVar1 = (int *)((long)&f->upvalues->name + lVar8);
      lVar8 = lVar8 + -0x18;
      uVar10 = uVar9;
    } while (*piVar1 == -1);
  }
  local_38 = CONCAT44(local_38._4_4_,uVar10);
  DumpBlock(&local_38,4,D);
  if (0 < (int)uVar10) {
    lVar8 = 0;
    do {
      if (D->strip == 0) {
        pTVar7 = *(TString **)((long)&f->upvalues->name + lVar8);
      }
      else {
        pTVar7 = (TString *)0x0;
      }
      DumpString(pTVar7,D);
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)((long)&f->upvalues->ravi_type_map + lVar8))
      ;
      DumpBlock(&local_38,4,D);
      DumpString(*(TString **)((long)&f->upvalues->usertype + lVar8),D);
      lVar8 = lVar8 + 0x18;
    } while ((ulong)uVar10 * 0x18 != lVar8);
  }
  return;
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}